

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl
          (LineTable *this,SectionedAddress Address,uint64_t Size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Result)

{
  SectionedAddress Address_00;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  pointer pSVar4;
  uint64_t uVar5;
  Sequence *pSVar6;
  uint32_t local_cc;
  uint64_t uStack_c8;
  uint32_t I;
  uint64_t local_c0;
  uint32_t local_b4;
  Sequence *pSStack_b0;
  uint32_t LastRowIndex;
  uint64_t local_a8;
  uint32_t local_9c;
  reference pSStack_98;
  uint32_t FirstRowIndex;
  Sequence *CurSeq;
  SequenceIter StartPos;
  __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
  local_78;
  SequenceIter SeqPos;
  SequenceIter LastSeq;
  Sequence Sequence;
  uint64_t EndAddr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Result_local;
  uint64_t Size_local;
  LineTable *this_local;
  SectionedAddress Address_local;
  
  uVar5 = Address.SectionIndex;
  pSVar6 = (Sequence *)Address.Address;
  bVar1 = std::
          vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>::
          empty(&this->Sequences);
  if (!bVar1) {
    uVar3 = (long)&pSVar6->LowPC + Size;
    DWARFDebugLine::Sequence::Sequence((Sequence *)&LastSeq);
    SeqPos._M_current =
         (Sequence *)
         std::
         vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>::
         end(&this->Sequences);
    local_78._M_current =
         (Sequence *)
         upper_bound<std::vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>const&,llvm::DWARFDebugLine::Sequence&,bool(*)(llvm::DWARFDebugLine::Sequence_const&,llvm::DWARFDebugLine::Sequence_const&)>
                   (&this->Sequences,(Sequence *)&LastSeq,DWARFDebugLine::Sequence::orderByHighPC);
    bVar1 = __gnu_cxx::operator==(&local_78,&SeqPos);
    if (!bVar1) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
               ::operator->(&local_78);
      StartPos._M_current = pSVar6;
      bVar1 = DWARFDebugLine::Sequence::containsPC(pSVar4,Address);
      if (bVar1) {
        CurSeq = local_78._M_current;
        while( true ) {
          bVar2 = __gnu_cxx::operator!=(&local_78,&SeqPos);
          bVar1 = false;
          if (bVar2) {
            pSVar4 = __gnu_cxx::
                     __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
                     ::operator->(&local_78);
            bVar1 = pSVar4->LowPC < uVar3;
          }
          if (!bVar1) {
            return true;
          }
          pSStack_98 = __gnu_cxx::
                       __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
                       ::operator*(&local_78);
          local_9c = pSStack_98->FirstRowIndex;
          bVar1 = __gnu_cxx::operator==
                            (&local_78,
                             (__normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
                              *)&CurSeq);
          if (bVar1) {
            pSStack_b0 = pSVar6;
            local_a8 = uVar5;
            local_9c = findRowInSeq(this,pSStack_98,Address);
          }
          uStack_c8 = uVar3 - 1;
          Address_00.SectionIndex = uVar5;
          Address_00.Address = uStack_c8;
          local_c0 = uVar5;
          local_b4 = findRowInSeq(this,pSStack_98,Address_00);
          if (local_b4 == this->UnknownRowIndex) {
            local_b4 = pSStack_98->LastRowIndex - 1;
          }
          if (local_9c == this->UnknownRowIndex) break;
          if (local_b4 == this->UnknownRowIndex) {
            __assert_fail("LastRowIndex != UnknownRowIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                          ,0x3f5,
                          "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                         );
          }
          for (local_cc = local_9c; local_cc <= local_b4; local_cc = local_cc + 1) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(Result,&local_cc);
          }
          __gnu_cxx::
          __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
          ::operator++(&local_78);
        }
        __assert_fail("FirstRowIndex != UnknownRowIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                      ,0x3f4,
                      "bool llvm::DWARFDebugLine::LineTable::lookupAddressRangeImpl(object::SectionedAddress, uint64_t, std::vector<uint32_t> &) const"
                     );
      }
    }
  }
  return false;
}

Assistant:

bool DWARFDebugLine::LineTable::lookupAddressRangeImpl(
    object::SectionedAddress Address, uint64_t Size,
    std::vector<uint32_t> &Result) const {
  if (Sequences.empty())
    return false;
  uint64_t EndAddr = Address.Address + Size;
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter LastSeq = Sequences.end();
  SequenceIter SeqPos = llvm::upper_bound(
      Sequences, Sequence, DWARFDebugLine::Sequence::orderByHighPC);
  if (SeqPos == LastSeq || !SeqPos->containsPC(Address))
    return false;

  SequenceIter StartPos = SeqPos;

  // Add the rows from the first sequence to the vector, starting with the
  // index we just calculated

  while (SeqPos != LastSeq && SeqPos->LowPC < EndAddr) {
    const DWARFDebugLine::Sequence &CurSeq = *SeqPos;
    // For the first sequence, we need to find which row in the sequence is the
    // first in our range.
    uint32_t FirstRowIndex = CurSeq.FirstRowIndex;
    if (SeqPos == StartPos)
      FirstRowIndex = findRowInSeq(CurSeq, Address);

    // Figure out the last row in the range.
    uint32_t LastRowIndex =
        findRowInSeq(CurSeq, {EndAddr - 1, Address.SectionIndex});
    if (LastRowIndex == UnknownRowIndex)
      LastRowIndex = CurSeq.LastRowIndex - 1;

    assert(FirstRowIndex != UnknownRowIndex);
    assert(LastRowIndex != UnknownRowIndex);

    for (uint32_t I = FirstRowIndex; I <= LastRowIndex; ++I) {
      Result.push_back(I);
    }

    ++SeqPos;
  }

  return true;
}